

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.h
# Opt level: O2

int __thiscall re2::Bitmap256::FindNextSetBit(Bitmap256 *this,int c)

{
  int iVar1;
  uint64_t n;
  uint uVar2;
  char *__assertion;
  
  if (c < 0) {
    __assertion = "(c) >= (0)";
    uVar2 = 0x56;
  }
  else {
    if ((uint)c < 0x100) {
      uVar2 = (uint)c >> 6;
      n = (this->words_[uVar2] >> ((byte)c & 0x3f)) << ((byte)c & 0x3f);
      if (n == 0) {
        if (uVar2 != 2) {
          if (uVar2 != 1) {
            if (uVar2 != 0) {
              return -1;
            }
            n = this->words_[1];
            if (n != 0) {
              uVar2 = 0x40;
              goto LAB_001dfa23;
            }
          }
          n = this->words_[2];
          uVar2 = 0x80;
          if (n != 0) goto LAB_001dfa23;
        }
        n = this->words_[3];
        uVar2 = 0xc0;
        if (n == 0) {
          return -1;
        }
      }
      else {
        uVar2 = c & 0xc0;
      }
LAB_001dfa23:
      iVar1 = FindLSBSet(n);
      return iVar1 + uVar2;
    }
    __assertion = "(c) <= (255)";
    uVar2 = 0x57;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/bitmap256.h"
                ,uVar2,"int re2::Bitmap256::FindNextSetBit(int) const");
}

Assistant:

int Bitmap256::FindNextSetBit(int c) const {
  DCHECK_GE(c, 0);
  DCHECK_LE(c, 255);

  // Check the word that contains the bit. Mask out any lower bits.
  int i = c / 64;
  uint64_t word = words_[i] & (~uint64_t{0} << (c % 64));
  if (word != 0)
    return (i * 64) + FindLSBSet(word);

  // Check any following words.
  i++;
  switch (i) {
    case 1:
      if (words_[1] != 0)
        return (1 * 64) + FindLSBSet(words_[1]);
      FALLTHROUGH_INTENDED;
    case 2:
      if (words_[2] != 0)
        return (2 * 64) + FindLSBSet(words_[2]);
      FALLTHROUGH_INTENDED;
    case 3:
      if (words_[3] != 0)
        return (3 * 64) + FindLSBSet(words_[3]);
      FALLTHROUGH_INTENDED;
    default:
      return -1;
  }
}